

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  IConfig *pIVar2;
  long in_RSI;
  string *in_RDI;
  ScopedElement e;
  TestCaseStats *in_stack_ffffffffffffff18;
  StreamingReporterBase *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *name;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar3;
  XmlWriter *this_00;
  XmlWriter *this_01;
  undefined1 local_99 [39];
  undefined1 local_72;
  allocator local_71;
  string local_70 [55];
  long local_10;
  
  local_10 = in_RSI;
  StreamingReporterBase::testCaseEnded(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this_00 = (XmlWriter *)&in_RDI[0xe].field_2;
  this_01 = (XmlWriter *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"OverallResult",(allocator *)this_01);
  XmlWriter::scopedElement(this_00,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"success",&local_71);
  local_72 = Counts::allOk((Counts *)(local_10 + 0x118));
  uVar3 = CONCAT13(local_72,(int3)in_stack_ffffffffffffff34);
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)CONCAT44(uVar3,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28,
             (bool *)in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pIVar2 = Ptr<Catch::IConfig>::operator->
                     ((Ptr<Catch::IConfig> *)&(in_RDI->field_2)._M_allocated_capacity);
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    name = (string *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_99 + 1),"durationInSeconds",(allocator *)name);
    in_stack_ffffffffffffff20 = (StreamingReporterBase *)Timer::getElapsedSeconds((Timer *)0x23c3b1)
    ;
    XmlWriter::ScopedElement::writeAttribute<double>
              ((ScopedElement *)CONCAT44(uVar3,iVar1),name,(double *)in_stack_ffffffffffffff20);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
  }
  XmlWriter::endElement(this_01);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
            e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

            m_xml.endElement();
        }